

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool google::protobuf::ServiceDescriptorProto::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *t;
  uint32_t *puVar2;
  ServiceDescriptorProto *this_;
  MessageLite *msg_local;
  
  t = _internal_method((ServiceDescriptorProto *)msg);
  bVar1 = internal::AllAreInitialized<google::protobuf::MethodDescriptorProto>(t);
  if (bVar1) {
    puVar2 = internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
    if (((*puVar2 & 2) == 0) ||
       (bVar1 = ServiceOptions::IsInitialized((ServiceOptions *)msg[3]._internal_metadata_.ptr_),
       bVar1)) {
      msg_local._7_1_ = true;
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool ServiceDescriptorProto::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const ServiceDescriptorProto&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_method()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.options_->IsInitialized()) return false;
  }
  return true;
}